

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<unsigned_int>::Matcher(Matcher<unsigned_int> *this,uint value)

{
  EqMatcher<unsigned_int> EVar1;
  Matcher<unsigned_int> *in_RDI;
  undefined4 in_stack_ffffffffffffffc4;
  EqMatcher<unsigned_int> *in_stack_ffffffffffffffe8;
  
  internal::MatcherBase<unsigned_int>::MatcherBase((MatcherBase<unsigned_int> *)0x146d4b);
  (in_RDI->super_MatcherBase<unsigned_int>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_002666b0
  ;
  EVar1 = Eq<unsigned_int>(0x146d62);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffe8);
  operator=((Matcher<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffc4,EVar1.rhs_),in_RDI);
  ~Matcher((Matcher<unsigned_int> *)0x146d9b);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }